

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int clamp_pframe_target_size(AV1_COMP *cpi,int64_t target,FRAME_UPDATE_TYPE frame_update_type)

{
  long local_48;
  int local_3c;
  int64_t max_rate;
  int min_frame_target;
  RateControlCfg *rc_cfg;
  RATE_CONTROL *rc;
  FRAME_UPDATE_TYPE frame_update_type_local;
  int64_t target_local;
  AV1_COMP *cpi_local;
  
  if ((cpi->rc).avg_frame_bandwidth >> 5 < (cpi->rc).min_frame_bandwidth) {
    local_3c = (cpi->rc).min_frame_bandwidth;
  }
  else {
    local_3c = (cpi->rc).avg_frame_bandwidth >> 5;
  }
  if ((frame_update_type == '\x04') || (frame_update_type == '\x05')) {
    target_local = (int64_t)local_3c;
  }
  else {
    target_local = target;
    if (target < local_3c) {
      target_local = (int64_t)local_3c;
    }
  }
  if ((cpi->rc).max_frame_bandwidth < target_local) {
    target_local = (int64_t)(cpi->rc).max_frame_bandwidth;
  }
  if ((cpi->oxcf).rc_cfg.max_inter_bitrate_pct != 0) {
    local_48 = (long)((long)(cpi->rc).avg_frame_bandwidth *
                     (ulong)(cpi->oxcf).rc_cfg.max_inter_bitrate_pct) / 100;
    if (target_local < local_48) {
      local_48 = target_local;
    }
    target_local = local_48;
  }
  return (int)target_local;
}

Assistant:

static int clamp_pframe_target_size(const AV1_COMP *const cpi, int64_t target,
                                    FRAME_UPDATE_TYPE frame_update_type) {
  const RATE_CONTROL *rc = &cpi->rc;
  const RateControlCfg *const rc_cfg = &cpi->oxcf.rc_cfg;
  const int min_frame_target =
      AOMMAX(rc->min_frame_bandwidth, rc->avg_frame_bandwidth >> 5);
  // Clip the frame target to the minimum setup value.
  if (frame_update_type == OVERLAY_UPDATE ||
      frame_update_type == INTNL_OVERLAY_UPDATE) {
    // If there is an active ARF at this location use the minimum
    // bits on this frame even if it is a constructed arf.
    // The active maximum quantizer insures that an appropriate
    // number of bits will be spent if needed for constructed ARFs.
    target = min_frame_target;
  } else if (target < min_frame_target) {
    target = min_frame_target;
  }

  // Clip the frame target to the maximum allowed value.
  if (target > rc->max_frame_bandwidth) target = rc->max_frame_bandwidth;
  if (rc_cfg->max_inter_bitrate_pct) {
    const int64_t max_rate =
        (int64_t)rc->avg_frame_bandwidth * rc_cfg->max_inter_bitrate_pct / 100;
    target = AOMMIN(target, max_rate);
  }

  return (int)target;
}